

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall
CLI::Option_group::Option_group
          (Option_group *this,string *group_description,string *group_name,App *parent)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  allocator local_69;
  string local_68;
  string local_48;
  App *local_28;
  App *parent_local;
  string *group_name_local;
  string *group_description_local;
  Option_group *this_local;
  
  local_28 = parent;
  parent_local = (App *)group_name;
  group_name_local = group_description;
  group_description_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)group_description);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_68,"",&local_69);
  App::App(&this->super_App,&local_48,&local_68,local_28);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Option_group_003b9000;
  ::std::__cxx11::string::string((string *)&local_a0,(string *)group_name);
  App::group(&this->super_App,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  uVar1 = ::std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (pcVar2 = (char *)::std::__cxx11::string::front(), *pcVar2 != '+')) {
    return;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
  App::set_help_flag(&this->super_App,&local_c0,&local_e8);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_110,"",&local_111);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_138,"",&local_139);
  App::set_help_all_flag(&this->super_App,&local_110,&local_138);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
  return;
}

Assistant:

Option_group(std::string group_description, std::string group_name, App *parent)
        : App(std::move(group_description), "", parent) {
        group(group_name);
        // option groups should have automatic fallthrough
        if(group_name.empty() || group_name.front() == '+') {
            // help will not be used by default in these contexts
            set_help_flag("");
            set_help_all_flag("");
        }
    }